

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::CSVMultiFileInfo::CreateReader
          (CSVMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *gstate_p,
          BaseUnionData *union_data_p,MultiFileBindData *bind_data)

{
  CSVFileScan *pCVar1;
  pointer pTVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<duckdb::BaseFileReader,_true> sVar3;
  bool local_46b;
  bool local_46a;
  undefined1 local_469;
  CSVFileScan *local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  ClientContext *local_458;
  vector<duckdb::LogicalType,_true> *local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_448;
  void *local_440;
  CSVReaderOptions options;
  
  local_458 = context;
  pTVar2 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  local_448 = &union_data_p->names;
  local_450 = &union_data_p->types;
  CSVReaderOptions::CSVReaderOptions(&options,(CSVReaderOptions *)(union_data_p + 1));
  options.auto_detect = false;
  local_46a = *(bool *)((long)&gstate_p[7]._vptr_GlobalTableFunctionState + 1);
  local_440 = (void *)0x0;
  local_46b = false;
  local_468 = (CSVFileScan *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVFileScan,std::allocator<duckdb::CSVFileScan>,duckdb::ClientContext&,std::__cxx11::string_const&,duckdb::CSVReaderOptions,duckdb::MultiFileOptions_const&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CSVSchema&,bool,decltype(nullptr),bool>
            (&local_460,&local_468,(allocator<duckdb::CSVFileScan> *)&local_469,local_458,
             &(union_data_p->file).path,&options,&bind_data->file_options,local_448,local_450,
             (CSVSchema *)&pTVar2[0x24].column_ids,&local_46a,&local_440,&local_46b);
  pCVar1 = local_468;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_460._M_pi)->_M_use_count = (local_460._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_460._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00b9fd65;
    }
    else {
      (local_460._M_pi)->_M_use_count = (local_460._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
LAB_00b9fd65:
  *(CSVFileScan **)this = pCVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_460._M_pi;
  CSVReaderOptions::~CSVReaderOptions(&options);
  sVar3.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar3.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> CSVMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &gstate_p,
                                                          BaseUnionData &union_data_p,
                                                          const MultiFileBindData &bind_data) {
	auto &union_data = union_data_p.Cast<CSVUnionData>();
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	// union readers - use cached options
	auto &csv_names = union_data.names;
	auto &csv_types = union_data.types;
	auto options = union_data.options;
	options.auto_detect = false;
	D_ASSERT(csv_data.csv_schema.Empty());
	return make_shared_ptr<CSVFileScan>(context, union_data.GetFileName(), std::move(options), bind_data.file_options,
	                                    csv_names, csv_types, csv_data.csv_schema, gstate.SingleThreadedRead(), nullptr,
	                                    false);
}